

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O0

void __thiscall
FListMenuItemPlayerDisplay::FListMenuItemPlayerDisplay
          (FListMenuItemPlayerDisplay *this,FListMenuDescriptor *menu,int x,int y,PalEntry c1,
          PalEntry c2,bool np,FName *action)

{
  BYTE BVar1;
  FBackdropTexture *this_00;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_50;
  int local_4c;
  int local_48;
  int b;
  int g;
  int r;
  int i;
  FName local_30;
  byte local_29;
  int local_28;
  int iStack_24;
  bool np_local;
  int y_local;
  int x_local;
  FListMenuDescriptor *menu_local;
  FListMenuItemPlayerDisplay *this_local;
  PalEntry c2_local;
  PalEntry c1_local;
  
  local_29 = np;
  local_28 = y;
  iStack_24 = x;
  _y_local = menu;
  menu_local = (FListMenuDescriptor *)this;
  this_local._0_4_ = c2.field_0;
  this_local._4_4_ = c1.field_0;
  FName::FName(&local_30,action);
  FListMenuItem::FListMenuItem(&this->super_FListMenuItem,x,y,&local_30);
  (this->super_FListMenuItem)._vptr_FListMenuItem =
       (_func_int **)&PTR__FListMenuItemPlayerDisplay_009eec98;
  FRemapTable::FRemapTable(&this->mRemap,0x100);
  this->mOwner = _y_local;
  for (g = 0; g < 0x100; g = g + 1) {
    b = (this_local._4_4_ >> 0x10 & 0xff) + (int)((this_local._0_4_ >> 0x10 & 0xff) * g) / 0xff;
    local_48 = (this_local._4_4_ >> 8 & 0xff) + (int)((this_local._0_4_ >> 8 & 0xff) * g) / 0xff;
    local_4c = (this_local._4_4_ & 0xff) + (int)((this_local._0_4_ & 0xff) * g) / 0xff;
    BVar1 = FColorMatcher::Pick(&ColorMatcher,b,local_48,local_4c);
    (this->mRemap).Remap[g] = BVar1;
    PalEntry::PalEntry((PalEntry *)&local_50.field_0,0xff,(BYTE)b,(BYTE)local_48,(BYTE)local_4c);
    (this->mRemap).Palette[g].field_0 = local_50;
  }
  this_00 = (FBackdropTexture *)operator_new(0x5e78);
  FBackdropTexture::FBackdropTexture(this_00);
  this->mBackdrop = (FTexture *)this_00;
  this->mPlayerClass = (FPlayerClass *)0x0;
  this->mPlayerState = (FState *)0x0;
  this->mNoportrait = (bool)(local_29 & 1);
  this->mMode = '\0';
  this->mRotation = '\0';
  this->mTranslate = '\0';
  this->mSkin = 0;
  this->mRandomClass = 0;
  this->mRandomTimer = 0;
  this->mClassNum = -1;
  return;
}

Assistant:

FListMenuItemPlayerDisplay::FListMenuItemPlayerDisplay(FListMenuDescriptor *menu, int x, int y, PalEntry c1, PalEntry c2, bool np, FName action)
: FListMenuItem(x, y, action)
{
	mOwner = menu;

	for (int i = 0; i < 256; i++)
	{
		int r = c1.r + c2.r * i / 255;
		int g = c1.g + c2.g * i / 255;
		int b = c1.b + c2.b * i / 255;
		mRemap.Remap[i] = ColorMatcher.Pick (r, g, b);
		mRemap.Palette[i] = PalEntry(255, r, g, b);
	}
	mBackdrop = new FBackdropTexture;
	mPlayerClass = NULL;
	mPlayerState = NULL;
	mNoportrait = np;
	mMode = 0;
	mRotation = 0;
	mTranslate = false;
	mSkin = 0;
	mRandomClass = 0;
	mRandomTimer = 0;
	mClassNum = -1;
}